

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

float stbtt__position_trapezoid_area(float height,float tx0,float tx1,float bx0,float bx1)

{
  float fVar1;
  float bx1_local;
  float bx0_local;
  float tx1_local;
  float tx0_local;
  float height_local;
  
  fVar1 = stbtt__sized_trapezoid_area(height,tx1 - tx0,bx1 - bx0);
  return fVar1;
}

Assistant:

static float stbtt__position_trapezoid_area(float height, float tx0, float tx1, float bx0, float bx1)
{
   return stbtt__sized_trapezoid_area(height, tx1 - tx0, bx1 - bx0);
}